

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

bool IR::Instr::OpndHasAnyImplicitCalls(Opnd *opnd,bool isSrc)

{
  bool bVar1;
  bool bVar2;
  SymOpnd *pSVar3;
  ListOpnd *pLVar4;
  long lVar5;
  int i;
  long lVar6;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2a;
  
  if (opnd != (Opnd *)0x0) {
    bVar1 = Opnd::IsSymOpnd(opnd);
    if ((bVar1) && (pSVar3 = Opnd::AsSymOpnd(opnd), pSVar3->m_sym->m_kind == SymKindProperty)) {
      return true;
    }
    bVar1 = Opnd::IsIndirOpnd(opnd);
    if (bVar1) {
      return true;
    }
    if (isSrc) {
      local_2a = (opnd->m_valueType).field_0;
      bVar1 = ValueType::IsPrimitive((ValueType *)&local_2a.field_0);
      if (!bVar1) {
        return true;
      }
    }
    bVar1 = Opnd::IsListOpnd(opnd);
    if (bVar1) {
      pLVar4 = Opnd::AsListOpnd(opnd);
      lVar6 = 0;
      do {
        lVar5 = (long)pLVar4->count;
        bVar1 = lVar6 < lVar5;
        if (lVar5 <= lVar6) {
          return bVar1;
        }
        bVar2 = OpndHasAnyImplicitCalls(&pLVar4->opnds[lVar6]->super_Opnd,isSrc);
        lVar6 = lVar6 + 1;
      } while (!bVar2);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Instr::OpndHasAnyImplicitCalls(IR::Opnd* opnd, bool isSrc)
{
    return opnd && (
        (opnd->IsSymOpnd() && opnd->AsSymOpnd()->m_sym->IsPropertySym()) ||
        opnd->IsIndirOpnd() ||
        (isSrc && !opnd->GetValueType().IsPrimitive()) ||
        (opnd->IsListOpnd() && opnd->AsListOpnd()->Any([isSrc](IR::Opnd* lOpnd) { return OpndHasAnyImplicitCalls(lOpnd, isSrc); }))
    );
}